

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SET_OF.c
# Opt level: O3

asn_enc_rval_t *
SET_OF_encode_xer(asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,void *sptr,
                 int ilevel,xer_encoder_flags_e flags,asn_app_consume_bytes_f *cb,void *app_key)

{
  asn_TYPE_member_s *paVar1;
  void *pvVar2;
  void *pvVar3;
  char *__s;
  bool bVar4;
  ssize_t sVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined8 *__base;
  size_t sVar9;
  asn_app_consume_bytes_f *paVar10;
  undefined8 *puVar11;
  int iVar12;
  long lVar13;
  char *__s_00;
  size_t __nmemb;
  long local_c0;
  size_t local_a0;
  asn_enc_rval_t local_48;
  
  paVar1 = td->elements;
  pvVar2 = td->specifics;
  bVar4 = true;
  if ((*(int *)((long)pvVar2 + 8) == 0) &&
     ((__s_00 = paVar1->name, *__s_00 != '\0' ||
      (__s_00 = paVar1->type->xml_tag, __s_00 != (char *)0x0)))) {
    local_a0 = strlen(__s_00);
    bVar4 = false;
  }
  else {
    __s_00 = (char *)0x0;
    local_a0 = 0;
  }
  if (sptr == (void *)0x0) {
    __return_storage_ptr__->encoded = -1;
    __return_storage_ptr__->failed_type = td;
    __return_storage_ptr__->structure_ptr = (void *)0x0;
    return __return_storage_ptr__;
  }
  iVar6 = *(int *)((long)sptr + 8);
  if ((flags & XER_F_CANONICAL) == 0) {
    __base = (undefined8 *)0x0;
    paVar10 = cb;
  }
  else {
    __base = (undefined8 *)malloc((long)iVar6 * 0x18);
    if (__base == (undefined8 *)0x0) {
      __return_storage_ptr__->encoded = -1;
      __return_storage_ptr__->failed_type = td;
      __return_storage_ptr__->structure_ptr = sptr;
      return __return_storage_ptr__;
    }
    paVar10 = SET_OF_encode_xer_callback;
  }
  __nmemb = 0;
  puVar11 = (undefined8 *)app_key;
  if (iVar6 < 1) {
    local_c0 = 0;
  }
  else {
    iVar12 = 0;
    if (0 < ilevel) {
      iVar12 = ilevel;
    }
    iVar8 = -1;
    if (-1 < ilevel) {
      iVar8 = ilevel;
    }
    lVar13 = 0;
    local_c0 = 0;
    do {
      pvVar3 = *(void **)(*sptr + lVar13 * 8);
      if (pvVar3 != (void *)0x0) {
        if (__base != (undefined8 *)0x0) {
          puVar11 = __base + __nmemb * 3;
          *puVar11 = 0;
          puVar11[1] = 0;
          puVar11[2] = 0;
          __nmemb = __nmemb + 1;
        }
        if (!bVar4) {
          if ((flags & XER_F_CANONICAL) == 0) {
            iVar6 = (*paVar10)("\n",1,puVar11);
            if (iVar6 < 0) goto LAB_001464b3;
            iVar6 = ilevel;
            if (0 < ilevel) {
              do {
                iVar7 = (*paVar10)("    ",4,puVar11);
                if (iVar7 < 0) goto LAB_001464c1;
                iVar6 = iVar6 + -1;
              } while (iVar6 != 0);
            }
            local_c0 = local_c0 + (ulong)(iVar12 * 4 + 1);
          }
          iVar6 = (*paVar10)("<",1,puVar11);
          if (((iVar6 < 0) || (iVar6 = (*paVar10)(__s_00,local_a0,puVar11), iVar6 < 0)) ||
             (iVar6 = (*paVar10)(">",1,puVar11), iVar6 < 0)) goto LAB_001464b3;
        }
        iVar6 = *(int *)((long)pvVar2 + 8);
        if (iVar6 == 1 && (flags & XER_F_CANONICAL) == 0) {
          iVar6 = (*paVar10)("\n",1,puVar11);
          if (iVar6 < 0) goto LAB_001464b3;
          iVar6 = iVar8 + 1;
          if (-1 < ilevel) {
            do {
              iVar7 = (*paVar10)("    ",4,puVar11);
              if (iVar7 < 0) goto LAB_001464c1;
              iVar6 = iVar6 + -1;
            } while (iVar6 != 0);
          }
          local_c0 = local_c0 + (iVar8 * 4 + 5);
          iVar6 = *(int *)((long)pvVar2 + 8);
        }
        (*paVar1->type->xer_encoder)
                  (&local_48,paVar1->type,pvVar3,(uint)(iVar6 != 2) + ilevel,flags,paVar10,puVar11);
        sVar5 = local_48.encoded;
        if (local_48.encoded == 0) {
          if (*(int *)((long)pvVar2 + 8) != 0) {
            __s = paVar1->type->xml_tag;
            sVar9 = strlen(__s);
            iVar6 = (*paVar10)("<",1,puVar11);
            if ((iVar6 < 0) || (iVar6 = (*paVar10)(__s,sVar9,puVar11), iVar6 < 0))
            goto LAB_001464c1;
            iVar6 = (*paVar10)("/>",2,puVar11);
            if (iVar6 < 0) goto LAB_001464b3;
          }
        }
        else if (local_48.encoded == -1) goto LAB_001464b3;
        if (!bVar4) {
          iVar6 = (*paVar10)("</",2,puVar11);
          if (((iVar6 < 0) || (iVar6 = (*paVar10)(__s_00,local_a0,puVar11), iVar6 < 0)) ||
             (iVar6 = (*paVar10)(">",1,puVar11), iVar6 < 0)) goto LAB_001464b3;
          local_c0 = local_c0 + 5;
        }
        local_c0 = local_c0 + sVar5 + local_a0 * 2;
        iVar6 = *(int *)((long)sptr + 8);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < iVar6);
  }
  if ((flags & XER_F_CANONICAL) == 0) {
    iVar6 = (*paVar10)("\n",1,puVar11);
    if (iVar6 < 0) {
LAB_001464b3:
      local_c0 = -1;
      goto LAB_001464cb;
    }
    iVar6 = 1;
    if (1 < ilevel) {
      iVar6 = ilevel;
    }
    iVar12 = iVar6 + -1;
    if (1 < ilevel) {
      do {
        iVar8 = (*paVar10)("    ",4,puVar11);
        if (iVar8 < 0) goto LAB_001464c1;
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
    }
    local_c0 = local_c0 + ((iVar6 + -1) * 4 + 1);
  }
  if (__base == (undefined8 *)0x0) goto LAB_00146505;
  qsort(__base,__nmemb,0x18,SET_OF_xer_order);
  if (0 < (long)__nmemb) {
    puVar11 = __base;
    do {
      iVar6 = (*cb)((void *)*puVar11,puVar11[1],app_key);
      if (iVar6 < 0) {
        local_c0 = -1;
        break;
      }
      free((void *)*puVar11);
      *puVar11 = 0;
      puVar11 = puVar11 + 3;
    } while (puVar11 < __base + __nmemb * 3);
    goto LAB_001464cb;
  }
LAB_001464d0:
  if (__nmemb != 0) {
    puVar11 = __base + __nmemb * 3 + -3;
    do {
      if ((void *)*puVar11 != (void *)0x0) {
        free((void *)*puVar11);
      }
      __nmemb = __nmemb - 1;
      puVar11 = puVar11 + -3;
    } while (__nmemb != 0);
  }
  free(__base);
LAB_00146505:
  __return_storage_ptr__->encoded = local_c0;
  __return_storage_ptr__->failed_type = (asn_TYPE_descriptor_s *)0x0;
  __return_storage_ptr__->structure_ptr = (void *)0x0;
  return __return_storage_ptr__;
LAB_001464c1:
  local_c0 = -1;
LAB_001464cb:
  if (__base == (undefined8 *)0x0) goto LAB_00146505;
  goto LAB_001464d0;
}

Assistant:

asn_enc_rval_t
SET_OF_encode_xer(asn_TYPE_descriptor_t *td, void *sptr,
	int ilevel, enum xer_encoder_flags_e flags,
		asn_app_consume_bytes_f *cb, void *app_key) {
	asn_enc_rval_t er;
	asn_SET_OF_specifics_t *specs = (asn_SET_OF_specifics_t *)td->specifics;
	asn_TYPE_member_t *elm = td->elements;
	asn_anonymous_set_ *list = _A_SET_FROM_VOID(sptr);
	const char *mname = specs->as_XMLValueList
		? 0 : ((*elm->name) ? elm->name : elm->type->xml_tag);
	size_t mlen = mname ? strlen(mname) : 0;
	int xcan = (flags & XER_F_CANONICAL);
	xer_tmp_enc_t *encs = 0;
	size_t encs_count = 0;
	void *original_app_key = app_key;
	asn_app_consume_bytes_f *original_cb = cb;
	int i;

	if(!sptr) ASN__ENCODE_FAILED;

	if(xcan) {
		encs = (xer_tmp_enc_t *)MALLOC(list->count * sizeof(encs[0]));
		if(!encs) ASN__ENCODE_FAILED;
		cb = SET_OF_encode_xer_callback;
	}

	er.encoded = 0;

	for(i = 0; i < list->count; i++) {
		asn_enc_rval_t tmper;

		void *memb_ptr = list->array[i];
		if(!memb_ptr) continue;

		if(encs) {
			memset(&encs[encs_count], 0, sizeof(encs[0]));
			app_key = &encs[encs_count];
			encs_count++;
		}

		if(mname) {
			if(!xcan) ASN__TEXT_INDENT(1, ilevel);
			ASN__CALLBACK3("<", 1, mname, mlen, ">", 1);
		}

		if(!xcan && specs->as_XMLValueList == 1)
			ASN__TEXT_INDENT(1, ilevel + 1);
		tmper = elm->type->xer_encoder(elm->type, memb_ptr,
				ilevel + (specs->as_XMLValueList != 2),
				flags, cb, app_key);
		if(tmper.encoded == -1) {
			td = tmper.failed_type;
			sptr = tmper.structure_ptr;
			goto cb_failed;
		}
		if(tmper.encoded == 0 && specs->as_XMLValueList) {
			const char *name = elm->type->xml_tag;
			size_t len = strlen(name);
			ASN__CALLBACK3("<", 1, name, len, "/>", 2);
		}

		if(mname) {
			ASN__CALLBACK3("</", 2, mname, mlen, ">", 1);
			er.encoded += 5;
		}

		er.encoded += (2 * mlen) + tmper.encoded;
	}

	if(!xcan) ASN__TEXT_INDENT(1, ilevel - 1);

	if(encs) {
		xer_tmp_enc_t *enc = encs;
		xer_tmp_enc_t *end = encs + encs_count;
		ssize_t control_size = 0;

		cb = original_cb;
		app_key = original_app_key;
		qsort(encs, encs_count, sizeof(encs[0]), SET_OF_xer_order);

		for(; enc < end; enc++) {
			ASN__CALLBACK(enc->buffer, enc->offset);
			FREEMEM(enc->buffer);
			enc->buffer = 0;
			control_size += enc->offset;
		}
		assert(control_size == er.encoded);
	}

	goto cleanup;
cb_failed:
	er.encoded = -1;
	er.failed_type = td;
	er.structure_ptr = sptr;
cleanup:
	if(encs) {
		while(encs_count-- > 0) {
			if(encs[encs_count].buffer)
				FREEMEM(encs[encs_count].buffer);
		}
		FREEMEM(encs);
	}
	ASN__ENCODED_OK(er);
}